

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O0

void imsg_close(imsgbuf *ibuf,ibuf *msg)

{
  undefined4 uVar1;
  ibuf *buf;
  msgbuf *in_RSI;
  imsg_hdr *hdr;
  
  buf = *(ibuf **)&in_RSI->queued;
  *(ushort *)((long)&(buf->entry).tqe_next + 6) =
       *(ushort *)((long)&(buf->entry).tqe_next + 6) & 0xfffe;
  if (*(int *)&in_RSI[2].bufs.tqh_last != -1) {
    *(ushort *)((long)&(buf->entry).tqe_next + 6) =
         *(ushort *)((long)&(buf->entry).tqe_next + 6) | 1;
  }
  uVar1 = in_RSI[1].queued;
  *(short *)((long)&(buf->entry).tqe_next + 4) = (short)uVar1;
  ibuf_close(in_RSI,buf);
  return;
}

Assistant:

void
imsg_close(struct imsgbuf *ibuf, struct ibuf *msg)
{
	struct imsg_hdr	*hdr;

	hdr = (struct imsg_hdr *)msg->buf;

	hdr->flags &= ~IMSGF_HASFD;
	if (msg->fd != -1)
		hdr->flags |= IMSGF_HASFD;

	hdr->len = (u_int16_t)msg->wpos;

	ibuf_close(&ibuf->w, msg);
}